

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

matrix<double> *
mat_lib::operator+(matrix<double> *__return_storage_ptr__,matrix<double> *a,matrix<double> *b)

{
  matrix<double> *m;
  ostream *poVar1;
  invalid_argument *this;
  matrix<double> c;
  string asStack_1b8 [32];
  matrix<double> local_198 [11];
  
  if ((a->rows__ == b->rows__) && (a->columns__ == b->columns__)) {
    matrix<double>::matrix(local_198,a);
    m = matrix<double>::operator+=(local_198,b);
    matrix<double>::matrix(__return_storage_ptr__,m);
    if (local_198[0].elements__ != (element_t *)0x0) {
      operator_delete__(local_198[0].elements__);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"size mismatch! cannot add matrices (",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"operator+",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"() in ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,0x213);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,asStack_1b8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t columns() const { return columns__; }